

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaGrammar.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::SchemaGrammar::addAnnotation(SchemaGrammar *this,XSAnnotation *annotation)

{
  RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher> *this_00;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar1;
  XSAnnotation *this_01;
  RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *pRVar2;
  
  this_00 = this->fAnnotations;
  pRVar1 = this_00->fBucketList[(ulong)this % this_00->fHashModulus];
  pRVar2 = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
  if (pRVar1 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) {
    do {
      pRVar2 = pRVar1;
      if ((SchemaGrammar *)pRVar1->fKey == this) break;
      pRVar1 = pRVar1->fNext;
      pRVar2 = (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0;
    } while (pRVar1 != (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0);
  }
  if (pRVar2 == (RefHashTableBucketElem<xercesc_4_0::XSAnnotation> *)0x0) {
    this_01 = (XSAnnotation *)0x0;
  }
  else {
    this_01 = pRVar2->fData;
  }
  if (this_01 == (XSAnnotation *)0x0) {
    RefHashTableOf<xercesc_4_0::XSAnnotation,_xercesc_4_0::PtrHasher>::put(this_00,this,annotation);
    return;
  }
  XSAnnotation::setNext(this_01,annotation);
  return;
}

Assistant:

void SchemaGrammar::addAnnotation(XSAnnotation* const annotation)
{
    XSAnnotation* lAnnot = fAnnotations->get(this);

    if (lAnnot)
        lAnnot->setNext(annotation);
    else
        fAnnotations->put(this, annotation);
}